

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O3

void re2::RE2Extract(void)

{
  bool bVar1;
  int iVar2;
  string s;
  StringPiece local_1d8;
  string local_1c8;
  StringPiece local_1a8;
  LogMessage local_198;
  
  local_1c8._M_string_length = 0;
  local_1c8.field_2._M_local_buf[0] = '\0';
  local_1d8.ptr_ = "boris@kremvax.ru";
  local_1d8.length_ = 0x10;
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  RE2::RE2((RE2 *)&local_198,"(.*)@([^.]*)");
  local_1a8.ptr_ = "\\2!\\1";
  local_1a8.length_ = 5;
  bVar1 = RE2::Extract(&local_1d8,(RE2 *)&local_198,&local_1a8,&local_1c8);
  RE2::~RE2((RE2 *)&local_198);
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0xda,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_198.str_,
               "Check failed: RE2::Extract(\"boris@kremvax.ru\", \"(.*)@([^.]*)\", \"\\\\2!\\\\1\", &s)"
               ,0x4d);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_198);
  }
  iVar2 = std::__cxx11::string::compare((char *)&local_1c8);
  if (iVar2 != 0) {
    LogMessage::LogMessage
              (&local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0xdb,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_198.str_,"Check failed: (s) == (\"kremvax!boris\")",0x26);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_198);
  }
  local_1d8.ptr_ = "foo";
  local_1d8.length_ = 3;
  RE2::RE2((RE2 *)&local_198,".*");
  local_1a8.ptr_ = "\'\\0\'";
  local_1a8.length_ = 4;
  bVar1 = RE2::Extract(&local_1d8,(RE2 *)&local_198,&local_1a8,&local_1c8);
  RE2::~RE2((RE2 *)&local_198);
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0xdd,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_198.str_,
               "Check failed: RE2::Extract(\"foo\", \".*\", \"\'\\\\0\'\", &s)",0x34);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_198);
  }
  iVar2 = std::__cxx11::string::compare((char *)&local_1c8);
  if (iVar2 != 0) {
    LogMessage::LogMessage
              (&local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0xde,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_198.str_,"Check failed: (s) == (\"\'foo\'\")",0x1e);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_198);
  }
  local_1d8.ptr_ = "baz";
  local_1d8.length_ = 3;
  RE2::RE2((RE2 *)&local_198,"bar");
  local_1a8.ptr_ = "\'\\0\'";
  local_1a8.length_ = 4;
  bVar1 = RE2::Extract(&local_1d8,(RE2 *)&local_198,&local_1a8,&local_1c8);
  RE2::~RE2((RE2 *)&local_198);
  if (bVar1) {
    LogMessage::LogMessage
              (&local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0xe0,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_198.str_,
               "Check failed: !RE2::Extract(\"baz\", \"bar\", \"\'\\\\0\'\", &s)",0x36);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_198);
  }
  iVar2 = std::__cxx11::string::compare((char *)&local_1c8);
  if (iVar2 != 0) {
    LogMessage::LogMessage
              (&local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0xe1,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_198.str_,"Check failed: (s) == (\"\'foo\'\")",0x1e);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_198);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p);
  }
  return;
}

Assistant:

TEST(CheckRewriteString, all) {
  TestCheckRewriteString("abc", "foo", true);
  TestCheckRewriteString("abc", "foo\\", false);
  TestCheckRewriteString("abc", "foo\\0bar", true);

  TestCheckRewriteString("a(b)c", "foo", true);
  TestCheckRewriteString("a(b)c", "foo\\0bar", true);
  TestCheckRewriteString("a(b)c", "foo\\1bar", true);
  TestCheckRewriteString("a(b)c", "foo\\2bar", false);
  TestCheckRewriteString("a(b)c", "f\\\\2o\\1o", true);

  TestCheckRewriteString("a(b)(c)", "foo\\12", true);
  TestCheckRewriteString("a(b)(c)", "f\\2o\\1o", true);
  TestCheckRewriteString("a(b)(c)", "f\\oo\\1", false);
}